

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_reader.cc
# Opt level: O1

bool __thiscall leveldb::log::Reader::ReadRecord(Reader *this,Slice *record,string *scratch)

{
  size_t sVar1;
  bool bVar2;
  size_t sVar3;
  bool bVar4;
  uint uVar5;
  char *pcVar6;
  bool bVar7;
  size_type sVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  Slice fragment;
  char buf [40];
  Slice local_68;
  char local_58 [40];
  
  if ((this->initial_offset_ <= this->last_record_offset_) ||
     (bVar4 = SkipToInitialBlock(this), bVar4)) {
    bVar2 = false;
    scratch->_M_string_length = 0;
    *(scratch->_M_dataplus)._M_p = '\0';
    record->data_ = "";
    record->size_ = 0;
    local_68.data_ = "";
    local_68.size_ = 0;
    uVar10 = 0;
    bVar4 = false;
    do {
      uVar5 = ReadPhysicalRecord(this,&local_68);
      sVar3 = local_68.size_;
      sVar1 = (this->buffer_).size_;
      if (this->resyncing_ == true) {
        bVar7 = false;
        if (uVar5 != 3) {
          if (uVar5 != 4) {
            this->resyncing_ = false;
            goto LAB_00111867;
          }
          this->resyncing_ = false;
        }
      }
      else {
LAB_00111867:
        if (uVar5 - 1 < 6) {
          uVar9 = (this->end_of_buffer_offset_ - (sVar1 + local_68.size_)) - 7;
          switch(uVar5) {
          case 1:
            if ((bVar2) && (scratch->_M_string_length != 0)) {
              ReportCorruption(this,scratch->_M_string_length,"partial record without end(1)");
            }
            scratch->_M_string_length = 0;
            *(scratch->_M_dataplus)._M_p = '\0';
            record->data_ = local_68.data_;
            record->size_ = local_68.size_;
            this->last_record_offset_ = uVar9;
            bVar7 = true;
            bVar4 = true;
            uVar10 = uVar9;
            break;
          case 2:
            if ((bVar2) && (scratch->_M_string_length != 0)) {
              ReportCorruption(this,scratch->_M_string_length,"partial record without end(2)");
            }
            bVar7 = false;
            std::__cxx11::string::_M_replace
                      ((ulong)scratch,0,(char *)scratch->_M_string_length,(ulong)local_68.data_);
            bVar2 = true;
            uVar10 = uVar9;
            break;
          case 3:
            if (bVar2) {
              std::__cxx11::string::append((char *)scratch,(ulong)local_68.data_);
            }
            else {
              pcVar6 = "missing start of fragmented record(1)";
LAB_00111a0a:
              ReportCorruption(this,local_68.size_,pcVar6);
            }
            bVar7 = false;
            break;
          case 4:
            if (!bVar2) {
              pcVar6 = "missing start of fragmented record(2)";
              goto LAB_00111a0a;
            }
            std::__cxx11::string::append((char *)scratch,(ulong)local_68.data_);
            sVar8 = scratch->_M_string_length;
            record->data_ = (scratch->_M_dataplus)._M_p;
            record->size_ = sVar8;
            this->last_record_offset_ = uVar10;
            bVar7 = true;
            bVar4 = true;
            break;
          case 5:
            bVar7 = true;
            if (bVar2) {
              scratch->_M_string_length = 0;
              *(scratch->_M_dataplus)._M_p = '\0';
            }
            bVar4 = false;
            break;
          case 6:
            bVar7 = false;
            if (bVar2) {
              sVar8 = scratch->_M_string_length;
              pcVar6 = "error in middle of record";
              goto LAB_00111a34;
            }
          }
        }
        else {
          snprintf(local_58,0x28,"unknown record type %u",(ulong)uVar5);
          if (bVar2) {
            sVar8 = scratch->_M_string_length;
          }
          else {
            sVar8 = 0;
          }
          sVar8 = sVar8 + sVar3;
          pcVar6 = local_58;
LAB_00111a34:
          ReportCorruption(this,sVar8,pcVar6);
          scratch->_M_string_length = 0;
          *(scratch->_M_dataplus)._M_p = '\0';
          bVar2 = false;
          bVar7 = false;
        }
      }
    } while (!bVar7);
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool Reader::ReadRecord(Slice* record, std::string* scratch) {
  if (last_record_offset_ < initial_offset_) {
    if (!SkipToInitialBlock()) {
      return false;
    }
  }

  scratch->clear();
  record->clear();
  bool in_fragmented_record = false;
  // Record offset of the logical record that we're reading
  // 0 is a dummy value to make compilers happy
  uint64_t prospective_record_offset = 0;

  Slice fragment;
  while (true) {
    const unsigned int record_type = ReadPhysicalRecord(&fragment);

    // ReadPhysicalRecord may have only had an empty trailer remaining in its
    // internal buffer. Calculate the offset of the next physical record now
    // that it has returned, properly accounting for its header size.
    uint64_t physical_record_offset =
        end_of_buffer_offset_ - buffer_.size() - kHeaderSize - fragment.size();

    if (resyncing_) {
      if (record_type == kMiddleType) {
        continue;
      } else if (record_type == kLastType) {
        resyncing_ = false;
        continue;
      } else {
        resyncing_ = false;
      }
    }

    switch (record_type) {
      case kFullType:
        if (in_fragmented_record) {
          // Handle bug in earlier versions of log::Writer where
          // it could emit an empty kFirstType record at the tail end
          // of a block followed by a kFullType or kFirstType record
          // at the beginning of the next block.
          if (!scratch->empty()) {
            ReportCorruption(scratch->size(), "partial record without end(1)");
          }
        }
        prospective_record_offset = physical_record_offset;
        scratch->clear();
        *record = fragment;
        last_record_offset_ = prospective_record_offset;
        return true;

      case kFirstType:
        if (in_fragmented_record) {
          // Handle bug in earlier versions of log::Writer where
          // it could emit an empty kFirstType record at the tail end
          // of a block followed by a kFullType or kFirstType record
          // at the beginning of the next block.
          if (!scratch->empty()) {
            ReportCorruption(scratch->size(), "partial record without end(2)");
          }
        }
        prospective_record_offset = physical_record_offset;
        scratch->assign(fragment.data(), fragment.size());
        in_fragmented_record = true;
        break;

      case kMiddleType:
        if (!in_fragmented_record) {
          ReportCorruption(fragment.size(),
                           "missing start of fragmented record(1)");
        } else {
          scratch->append(fragment.data(), fragment.size());
        }
        break;

      case kLastType:
        if (!in_fragmented_record) {
          ReportCorruption(fragment.size(),
                           "missing start of fragmented record(2)");
        } else {
          scratch->append(fragment.data(), fragment.size());
          *record = Slice(*scratch);
          last_record_offset_ = prospective_record_offset;
          return true;
        }
        break;

      case kEof:
        if (in_fragmented_record) {
          // This can be caused by the writer dying immediately after
          // writing a physical record but before completing the next; don't
          // treat it as a corruption, just ignore the entire logical record.
          scratch->clear();
        }
        return false;

      case kBadRecord:
        if (in_fragmented_record) {
          ReportCorruption(scratch->size(), "error in middle of record");
          in_fragmented_record = false;
          scratch->clear();
        }
        break;

      default: {
        char buf[40];
        snprintf(buf, sizeof(buf), "unknown record type %u", record_type);
        ReportCorruption(
            (fragment.size() + (in_fragmented_record ? scratch->size() : 0)),
            buf);
        in_fragmented_record = false;
        scratch->clear();
        break;
      }
    }
  }
  return false;
}